

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# STEPFile.h
# Opt level: O3

Object * Assimp::STEP::ObjectHelper<Assimp::IFC::Schema_2x3::IfcControl,_0UL>::Construct
                   (DB *db,LIST *params)

{
  IfcObject *this;
  
  this = (IfcObject *)operator_new(0xf8);
  *(undefined ***)&this->field_0xe0 = &PTR__Object_008ee2a0;
  *(undefined8 *)(this + 1) = 0;
  *(char **)&this[1].field_0x8 = "IfcControl";
  Assimp::IFC::Schema_2x3::IfcObject::IfcObject(this,&PTR_construction_vtable_24__008f5d28);
  *(undefined ***)this = &PTR__IfcControl_008f5c70;
  *(undefined ***)&this->field_0xe0 = &PTR__IfcControl_008f5d10;
  *(undefined ***)&this->field_0x88 = &PTR__IfcControl_008f5c98;
  (this->super_ObjectHelper<Assimp::IFC::Schema_2x3::IfcObject,_1UL>)._vptr_ObjectHelper =
       (_func_int **)&PTR__IfcControl_008f5cc0;
  *(undefined ***)&this->field_0xd0 = &PTR__IfcControl_008f5ce8;
  GenericFill<Assimp::IFC::Schema_2x3::IfcObject>(db,params,this);
  return (Object *)(&this->field_0x0 + *(long *)(*(long *)this + -0x18));
}

Assistant:

static Object* Construct(const STEP::DB& db, const EXPRESS::LIST& params) {
            // make sure we don't leak if Fill() throws an exception
            std::unique_ptr<TDerived> impl(new TDerived());

            // GenericFill<T> is undefined so we need to have a specialization
            const size_t num_args = GenericFill<TDerived>(db,params,&*impl);
            (void)num_args;

            // the following check is commented because it will always trigger if
            // parts of the entities are generated with dummy wrapper code.
            // This is currently done to reduce the size of the loader
            // code.
            //if (num_args != params.GetSize() && impl->GetClassName() != "NotImplemented") {
            //  DefaultLogger::get()->debug("STEP: not all parameters consumed");
            //}
            return impl.release();
        }